

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_modified(MODIFIED_HANDLE modified)

{
  AMQP_VALUE pAVar1;
  
  if (modified != (MODIFIED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(modified->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_modified(MODIFIED_HANDLE modified)
{
    AMQP_VALUE result;

    if (modified == NULL)
    {
        result = NULL;
    }
    else
    {
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        result = amqpvalue_clone(modified_instance->composite_value);
    }

    return result;
}